

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constructHelpers.h
# Opt level: O0

void Corrade::Containers::Implementation::
     construct<Corrade::Utility::Arguments::Entry,Corrade::Utility::Arguments::Type,char&,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,unsigned_long>
               (Entry *value,Type *first,char *next,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *next_1,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *next_2,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *next_3,
               unsigned_long *next_4)

{
  Type type;
  char shortKey;
  Type *pTVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  unsigned_long *puVar4;
  string local_98;
  string local_78;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *next_local_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *next_local_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *next_local_1;
  char *next_local;
  Type *first_local;
  Entry *value_local;
  
  local_38 = next_3;
  next_local_3 = next_2;
  next_local_2 = next_1;
  next_local_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)next;
  next_local = (char *)first;
  first_local = &value->type;
  pTVar1 = Utility::forward<Corrade::Utility::Arguments::Type>(first);
  type = *pTVar1;
  pcVar2 = Utility::forward<char&>((type_conflict3 *)next_local_1);
  shortKey = *pcVar2;
  pbVar3 = Utility::forward<std::__cxx11::string>(next_local_2);
  std::__cxx11::string::string((string *)&local_58,(string *)pbVar3);
  pbVar3 = Utility::forward<std::__cxx11::string>(next_local_3);
  std::__cxx11::string::string((string *)&local_78,(string *)pbVar3);
  pbVar3 = Utility::forward<std::__cxx11::string>(local_38);
  std::__cxx11::string::string((string *)&local_98,(string *)pbVar3);
  puVar4 = Utility::forward<unsigned_long>(next_4);
  Utility::Arguments::Entry::Entry(value,type,shortKey,&local_58,&local_78,&local_98,*puVar4);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

inline void construct(T& value, First&& first, Next&& ...next) {
    new(&value) T{Utility::forward<First>(first), Utility::forward<Next>(next)...};
}